

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_info.cpp
# Opt level: O0

void __thiscall singleton::DeviceInfoSigleton::~DeviceInfoSigleton(DeviceInfoSigleton *this)

{
  DeviceInfoSigleton *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DeviceInfoSigleton::~DeviceInfoSigleton() {}